

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnexpectedCommand.h
# Opt level: O3

void __thiscall cmUnexpectedCommand::~cmUnexpectedCommand(cmUnexpectedCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmUnexpectedCommand_006226d8;
  pcVar2 = (this->Name)._M_dataplus._M_p;
  paVar1 = &(this->Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmCommand_0061f780;
  pcVar2 = (this->super_cmCommand).Error._M_dataplus._M_p;
  paVar1 = &(this->super_cmCommand).Error.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x58);
  return;
}

Assistant:

cmUnexpectedCommand(std::string name, const char* error)
    : Name(std::move(name))
    , Error(error)
  {
  }